

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

void __thiscall OPL::DOSBox::DBOPL::Channel::SetChanData(Channel *this,Chip *chip,Bit32u data)

{
  Operator *this_00;
  uint uVar1;
  
  uVar1 = this->chanData ^ data;
  this->chanData = data;
  this->op[0].chanData = data;
  this_00 = this->op + 1;
  this->op[1].chanData = data;
  Operator::UpdateFrequency(this->op);
  Operator::UpdateFrequency(this_00);
  if ((uVar1 & 0xff0000) != 0) {
    Operator::UpdateAttenuation(this->op);
    Operator::UpdateAttenuation(this_00);
  }
  if (uVar1 < 0x1000000) {
    return;
  }
  Operator::UpdateRates(this->op,chip);
  Operator::UpdateRates(this_00,chip);
  return;
}

Assistant:

void Channel::SetChanData( const Chip* chip, Bit32u data ) {
	Bit32u change = chanData ^ data;
	chanData = data;
	Op( 0 )->chanData = data;
	Op( 1 )->chanData = data;
	//Since a frequency update triggered this, always update frequency
	Op( 0 )->UpdateFrequency();
	Op( 1 )->UpdateFrequency();
	if ( change & ( 0xff << SHIFT_KSLBASE ) ) {
		Op( 0 )->UpdateAttenuation();
		Op( 1 )->UpdateAttenuation();
	}
	if ( change & ( 0xff << SHIFT_KEYCODE ) ) {
		Op( 0 )->UpdateRates( chip );
		Op( 1 )->UpdateRates( chip );
	}
}